

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O1

EffectState * __thiscall anon_unknown.dwarf_1878d6::NullStateFactory::create(NullStateFactory *this)

{
  EffectState *pEVar1;
  undefined8 *puVar2;
  
  pEVar1 = (EffectState *)al_malloc(8,0x20);
  if (pEVar1 != (EffectState *)0x0) {
    (pEVar1->super_intrusive_ref<EffectState>).mRef.super___atomic_base<unsigned_int>._M_i = 1;
    (pEVar1->mOutTarget).mData = (pointer)0x0;
    (pEVar1->mOutTarget).mDataEnd = (pointer)0x0;
    pEVar1->_vptr_EffectState = (_func_int **)&PTR__EffectState_001b0bf0;
    return pEVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = pthread_once;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EffectState *NullStateFactory::create()
{ return new NullState{}; }